

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int monty_reduce_internal(MontyContext *mc,mp_int *x,mp_int scratch)

{
  BignumInt *pBVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  mp_int *b;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  BignumInt BVar9;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int mVar10;
  mp_int x_lo;
  mp_int k;
  mp_int mk;
  mp_int toret;
  mp_int local_68;
  mp_int local_58;
  mp_int local_48;
  mp_int local_38;
  
  uVar7 = scratch.nw;
  local_68.w = x->w;
  local_68.nw = mc->rbits;
  if (x->nw < mc->rbits) {
    local_68.nw = x->nw;
  }
  uVar4 = mc->rw;
  if (uVar4 <= uVar7) {
    if (uVar7 - uVar4 < uVar7) {
      uVar7 = uVar7 - uVar4;
    }
    pBVar1 = scratch.w + uVar4;
    scratch_00.w = pBVar1;
    scratch_00.nw = uVar7;
    local_58.nw = uVar4;
    local_58.w = scratch.w;
    mp_mul_internal(&local_58,&local_68,mc->minus_minv_mod_r,scratch_00);
    uVar4 = mc->pw;
    if (uVar4 <= uVar7) {
      if (uVar7 - uVar4 < uVar7) {
        uVar7 = uVar7 - uVar4;
      }
      scratch_01.w = pBVar1 + uVar4;
      scratch_01.nw = uVar7;
      local_48.nw = uVar4;
      local_48.w = pBVar1;
      mp_mul_internal(&local_48,mc->m,&local_58,scratch_01);
      if (uVar4 != 0) {
        uVar7 = x->nw;
        uVar8 = 0;
        uVar6 = 0;
        do {
          if (uVar6 < uVar7) {
            BVar9 = x->w[uVar6];
          }
          else {
            BVar9 = 0;
          }
          puVar2 = pBVar1 + uVar6;
          uVar3 = *puVar2;
          *puVar2 = *puVar2 + BVar9 + uVar8;
          uVar8 = (ulong)CARRY8(BVar9,uVar8) + (ulong)CARRY8(uVar3,BVar9 + uVar8);
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      uVar7 = mc->rw;
      uVar6 = uVar7;
      if (uVar4 < uVar7) {
        uVar6 = uVar4;
      }
      uVar8 = uVar4 - uVar6;
      if (uVar4 - uVar7 <= uVar4 - uVar6) {
        uVar8 = uVar4 - uVar7;
      }
      pBVar1 = pBVar1 + uVar6;
      b = mc->m;
      local_38.nw = uVar8;
      local_38.w = pBVar1;
      uVar5 = mp_cmp_hs(&local_38,b);
      BVar9 = -(ulong)uVar5;
      mp_add_masked_into(pBVar1,uVar8,&local_38,b,BVar9,BVar9,(ulong)((uint)BVar9 & 1));
      mVar10.w = pBVar1;
      mVar10.nw = uVar8;
      return mVar10;
    }
  }
  __assert_fail("len <= pool->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
}

Assistant:

static mp_int monty_reduce_internal(MontyContext *mc, mp_int *x, mp_int scratch)
{
    /*
     * The trick with Montgomery reduction is that on the one hand we
     * want to reduce the size of the input by a factor of about r,
     * and on the other hand, the two numbers we just multiplied were
     * both stored with an extra factor of r multiplied in. So we
     * computed ar*br = ab r^2, but we want to return abr, so we need
     * to divide by r - and if we can do that by _actually dividing_
     * by r then this also reduces the size of the number.
     *
     * But we can only do that if the number we're dividing by r is a
     * multiple of r. So first we must add an adjustment to it which
     * clears its bottom 'rbits' bits. That adjustment must be a
     * multiple of m in order to leave the residue mod n unchanged, so
     * the question is, what multiple of m can we add to x to make it
     * congruent to 0 mod r? And the answer is, x * (-m)^{-1} mod r.
     */

    /* x mod r */
    mp_int x_lo = mp_make_alias(x, 0, mc->rbits);

    /* x * (-m)^{-1}, i.e. the number we want to multiply by m */
    mp_int k = mp_alloc_from_scratch(&scratch, mc->rw);
    mp_mul_internal(&k, &x_lo, mc->minus_minv_mod_r, scratch);

    /* m times that, i.e. the number we want to add to x */
    mp_int mk = mp_alloc_from_scratch(&scratch, mc->pw);
    mp_mul_internal(&mk, mc->m, &k, scratch);

    /* Add it to x */
    mp_add_into(&mk, x, &mk);

    /* Reduce mod r, by simply making an alias to the upper words of x */
    mp_int toret = mp_make_alias(&mk, mc->rw, mk.nw - mc->rw);

    /*
     * We'll generally be doing this after a multiplication of two
     * fully reduced values. So our input could be anything up to m^2,
     * and then we added up to rm to it. Hence, the maximum value is
     * rm+m^2, and after dividing by r, that becomes r + m(m/r) < 2r.
     * So a single trial-subtraction will finish reducing to the
     * interval [0,m).
     */
    mp_cond_sub_into(&toret, &toret, mc->m, mp_cmp_hs(&toret, mc->m));
    return toret;
}